

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::StyledStreamWriter::writeValue(StyledStreamWriter *this,Value *value)

{
  pointer *__return_storage_ptr__;
  bool bVar1;
  ValueType VVar2;
  Json *pJVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__lhs;
  PrecisionType precisionType;
  bool value_00;
  LargestInt value_01;
  LargestUInt value_02;
  undefined1 in_R8B;
  double value_03;
  undefined1 auVar4 [16];
  allocator<char> local_1f9;
  String local_1f8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d8;
  String local_1d0;
  Value *local_1b0;
  Value *childValue;
  String *name;
  iterator it;
  String local_190;
  allocator<char> local_169;
  String local_168;
  undefined1 local_148 [8];
  Members members;
  allocator<char> local_109;
  String local_108;
  String local_e8;
  undefined1 local_c1;
  int local_c0;
  bool ok;
  char *end;
  char *str;
  String local_90;
  String local_70;
  allocator<char> local_39;
  String local_38;
  Value *local_18;
  Value *value_local;
  StyledStreamWriter *this_local;
  
  local_18 = value;
  value_local = (Value *)this;
  VVar2 = Value::type(value);
  precisionType = 0x17c8fc;
  switch(VVar2) {
  case nullValue:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"null",&local_39);
    pushValue(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    break;
  case intValue:
    pJVar3 = (Json *)Value::asLargestInt(local_18);
    valueToString_abi_cxx11_(&local_70,pJVar3,value_01);
    pushValue(this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    break;
  case uintValue:
    pJVar3 = (Json *)Value::asLargestUInt(local_18);
    valueToString_abi_cxx11_(&local_90,pJVar3,value_02);
    pushValue(this,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    break;
  case realValue:
    value_03 = Value::asDouble(local_18);
    valueToString_abi_cxx11_((String *)&str,(Json *)0x11,value_03,0,precisionType);
    pushValue(this,(String *)&str);
    std::__cxx11::string::~string((string *)&str);
    break;
  case stringValue:
    local_c1 = Value::getString(local_18,&end,(char **)&local_c0);
    if ((bool)local_c1) {
      valueToQuotedStringN_abi_cxx11_
                (&local_e8,(Json *)end,(char *)(ulong)(uint)(local_c0 - (int)end),0,(bool)in_R8B);
      pushValue(this,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_109);
      pushValue(this,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator(&local_109);
    }
    break;
  case booleanValue:
    bVar1 = Value::asBool(local_18);
    __return_storage_ptr__ =
         &members.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    valueToString_abi_cxx11_((String *)__return_storage_ptr__,(Json *)(ulong)bVar1,value_00);
    pushValue(this,(String *)__return_storage_ptr__);
    std::__cxx11::string::~string
              ((string *)
               &members.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    break;
  case arrayValue:
    writeArrayValue(this,local_18);
    break;
  case objectValue:
    Value::getMemberNames_abi_cxx11_((Members *)local_148,local_18);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_148);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"{}",&local_169);
      pushValue(this,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,"{",(allocator<char> *)((long)&it._M_current + 7));
      writeWithIndent(this,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
      indent(this);
      name = (String *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_148);
      while( true ) {
        childValue = (Value *)__gnu_cxx::
                              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&name);
        local_1b0 = Value::operator[](local_18,(String *)childValue);
        writeCommentBeforeValue(this,local_1b0);
        auVar4 = std::__cxx11::string::c_str();
        valueToQuotedString_abi_cxx11_(&local_1d0,auVar4._0_8_,auVar4._8_8_);
        writeWithIndent(this,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::operator<<(this->document_," : ");
        writeValue(this,local_1b0);
        __lhs = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&name);
        local_1d8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_148);
        bVar1 = __gnu_cxx::operator==(__lhs,&local_1d8);
        if (bVar1) break;
        std::operator<<(this->document_,",");
        writeCommentAfterValueOnSameLine(this,local_1b0);
      }
      writeCommentAfterValueOnSameLine(this,local_1b0);
      unindent(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"}",&local_1f9);
      writeWithIndent(this,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator(&local_1f9);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_148);
  }
  return;
}

Assistant:

void StyledStreamWriter::writeValue(const Value& value) {
  switch (value.type()) {
  case nullValue:
    pushValue("null");
    break;
  case intValue:
    pushValue(valueToString(value.asLargestInt()));
    break;
  case uintValue:
    pushValue(valueToString(value.asLargestUInt()));
    break;
  case realValue:
    pushValue(valueToString(value.asDouble()));
    break;
  case stringValue: {
    // Is NULL possible for value.string_? No.
    char const* str;
    char const* end;
    bool ok = value.getString(&str, &end);
    if (ok)
      pushValue(valueToQuotedStringN(str, static_cast<unsigned>(end - str)));
    else
      pushValue("");
    break;
  }
  case booleanValue:
    pushValue(valueToString(value.asBool()));
    break;
  case arrayValue:
    writeArrayValue(value);
    break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    if (members.empty())
      pushValue("{}");
    else {
      writeWithIndent("{");
      indent();
      auto it = members.begin();
      for (;;) {
        const String& name = *it;
        const Value& childValue = value[name];
        writeCommentBeforeValue(childValue);
        writeWithIndent(valueToQuotedString(name.c_str()));
        *document_ << " : ";
        writeValue(childValue);
        if (++it == members.end()) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        *document_ << ",";
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("}");
    }
  } break;
  }
}